

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O0

bool __thiscall slang::parsing::ParserBase::haveDiagAtCurrentLoc(ParserBase *this)

{
  bool bVar1;
  reference pDVar2;
  SourceLocation location;
  Diagnostics *diags;
  ParserBase *in_stack_ffffffffffffffa8;
  Diagnostic *in_stack_ffffffffffffffb0;
  SourceLocation *this_00;
  bool local_41;
  bool local_31;
  ParserBase *local_30;
  ParserBase *this_01;
  SourceLocation local_20;
  SourceLocation local_18;
  SmallVectorBase<slang::Diagnostic> *local_10;
  
  this_01 = local_30;
  local_10 = (SmallVectorBase<slang::Diagnostic> *)getDiagnostics((ParserBase *)0x33a3d8);
  local_18 = getLastLocation(this_01);
  bVar1 = SmallVectorBase<slang::Diagnostic>::empty(local_10);
  local_31 = false;
  if (!bVar1) {
    SmallVectorBase<slang::Diagnostic>::back(local_10);
    bVar1 = Diagnostic::isError(in_stack_ffffffffffffffb0);
    local_31 = false;
    if (bVar1) {
      pDVar2 = SmallVectorBase<slang::Diagnostic>::back(local_10);
      bVar1 = SourceLocation::operator==(&pDVar2->location,&local_18);
      local_41 = true;
      if (!bVar1) {
        pDVar2 = SmallVectorBase<slang::Diagnostic>::back(local_10);
        this_00 = &pDVar2->location;
        _local_30 = peek(in_stack_ffffffffffffffa8);
        local_20 = Token::location((Token *)&local_30);
        local_41 = SourceLocation::operator==(this_00,&local_20);
      }
      local_31 = local_41;
    }
  }
  return local_31;
}

Assistant:

bool ParserBase::haveDiagAtCurrentLoc() {
    Diagnostics& diags = getDiagnostics();
    auto location = getLastLocation();
    return !diags.empty() && diags.back().isError() &&
           (diags.back().location == location || diags.back().location == peek().location());
}